

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionParser.cxx
# Opt level: O1

void extendText(vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                *result,const_iterator it)

{
  cmGeneratorExpressionEvaluator *pcVar1;
  pointer ppcVar2;
  _func_int **pp_Var3;
  _func_int **pp_Var4;
  int iVar5;
  cmGeneratorExpressionEvaluator *local_18;
  
  ppcVar2 = (result->
            super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (((result->
       super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
       )._M_impl.super__Vector_impl_data._M_start != ppcVar2) &&
     (iVar5 = (*ppcVar2[-1]->_vptr_cmGeneratorExpressionEvaluator[2])(), iVar5 == 0)) {
    pcVar1 = (result->
             super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
             )._M_impl.super__Vector_impl_data._M_finish[-1] + 2;
    pcVar1->_vptr_cmGeneratorExpressionEvaluator =
         (_func_int **)
         ((long)pcVar1->_vptr_cmGeneratorExpressionEvaluator + (it._M_current)->Length);
    return;
  }
  local_18 = (cmGeneratorExpressionEvaluator *)operator_new(0x18);
  pp_Var3 = (_func_int **)(it._M_current)->Content;
  pp_Var4 = (_func_int **)(it._M_current)->Length;
  local_18->_vptr_cmGeneratorExpressionEvaluator =
       (_func_int **)&PTR__cmGeneratorExpressionEvaluator_00634c68;
  local_18[1]._vptr_cmGeneratorExpressionEvaluator = pp_Var3;
  local_18[2]._vptr_cmGeneratorExpressionEvaluator = pp_Var4;
  std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>::
  emplace_back<cmGeneratorExpressionEvaluator*>
            ((vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>
              *)result,&local_18);
  return;
}

Assistant:

static void extendText(
  std::vector<cmGeneratorExpressionEvaluator*>& result,
  std::vector<cmGeneratorExpressionToken>::const_iterator it)
{
  if (!result.empty() &&
      (*(result.end() - 1))->GetType() ==
        cmGeneratorExpressionEvaluator::Text) {
    TextContent* textContent = static_cast<TextContent*>(*(result.end() - 1));
    textContent->Extend(it->Length);
  } else {
    TextContent* textContent = new TextContent(it->Content, it->Length);
    result.push_back(textContent);
  }
}